

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_type(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  uint local_1c;
  uint32_t t;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  if ((uint)((int)(rd->argv->field_4).it >> 0xf) < 0xfffffff3) {
    local_1c = 0xd;
  }
  else {
    local_1c = (int)(rd->argv->field_4).it >> 0xf ^ 0xffffffff;
  }
  TVar1 = lj_ir_kgc(J,(GCobj *)(*(ulong *)((long)J->fn + (ulong)local_1c * 8 + 0x30) &
                               0x7fffffffffff),IRT_STR);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_type(jit_State *J, RecordFFData *rd)
{
  /* Arguments already specialized. Result is a constant string. Neat, huh? */
  uint32_t t;
  if (tvisnumber(&rd->argv[0]))
    t = ~LJ_TNUMX;
  else if (LJ_64 && !LJ_GC64 && tvislightud(&rd->argv[0]))
    t = ~LJ_TLIGHTUD;
  else
    t = ~itype(&rd->argv[0]);
  J->base[0] = lj_ir_kstr(J, strV(&J->fn->c.upvalue[t]));
  UNUSED(rd);
}